

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

NonIterableBitMask<unsigned_short,_16,_0> __thiscall
absl::lts_20250127::container_internal::GroupSse2Impl::MaskEmpty(GroupSse2Impl *this)

{
  longlong lVar1;
  longlong lVar2;
  undefined1 auVar3 [16];
  __m128i match;
  GroupSse2Impl *this_local;
  char local_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  byte bStack_59;
  undefined1 local_49;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_18;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  undefined1 local_10;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  
  local_49 = 0x80;
  local_9 = 0x80;
  local_a = 0x80;
  local_b = 0x80;
  local_c = 0x80;
  local_d = 0x80;
  local_e = 0x80;
  local_f = 0x80;
  local_10 = 0x80;
  local_11 = 0x80;
  local_12 = 0x80;
  local_13 = 0x80;
  local_14 = 0x80;
  local_15 = 0x80;
  local_16 = 0x80;
  local_17 = 0x80;
  local_18 = 0x80;
  local_38 = 0x8080808080808080;
  uStack_30 = 0x8080808080808080;
  lVar1 = this->ctrl[0];
  lVar2 = this->ctrl[1];
  local_48._0_1_ = (char)lVar1;
  local_48._1_1_ = (char)((ulong)lVar1 >> 8);
  local_48._2_1_ = (char)((ulong)lVar1 >> 0x10);
  local_48._3_1_ = (char)((ulong)lVar1 >> 0x18);
  local_48._4_1_ = (char)((ulong)lVar1 >> 0x20);
  local_48._5_1_ = (char)((ulong)lVar1 >> 0x28);
  local_48._6_1_ = (char)((ulong)lVar1 >> 0x30);
  local_48._7_1_ = (char)((ulong)lVar1 >> 0x38);
  uStack_40._0_1_ = (char)lVar2;
  uStack_40._1_1_ = (char)((ulong)lVar2 >> 8);
  uStack_40._2_1_ = (char)((ulong)lVar2 >> 0x10);
  uStack_40._3_1_ = (char)((ulong)lVar2 >> 0x18);
  uStack_40._4_1_ = (char)((ulong)lVar2 >> 0x20);
  uStack_40._5_1_ = (char)((ulong)lVar2 >> 0x28);
  uStack_40._6_1_ = (char)((ulong)lVar2 >> 0x30);
  uStack_40._7_1_ = (char)((ulong)lVar2 >> 0x38);
  local_68 = -((char)local_48 == -0x80);
  cStack_67 = -(local_48._1_1_ == -0x80);
  cStack_66 = -(local_48._2_1_ == -0x80);
  cStack_65 = -(local_48._3_1_ == -0x80);
  cStack_64 = -(local_48._4_1_ == -0x80);
  cStack_63 = -(local_48._5_1_ == -0x80);
  cStack_62 = -(local_48._6_1_ == -0x80);
  cStack_61 = -(local_48._7_1_ == -0x80);
  cStack_60 = -((char)uStack_40 == -0x80);
  cStack_5f = -(uStack_40._1_1_ == -0x80);
  cStack_5e = -(uStack_40._2_1_ == -0x80);
  cStack_5d = -(uStack_40._3_1_ == -0x80);
  cStack_5c = -(uStack_40._4_1_ == -0x80);
  cStack_5b = -(uStack_40._5_1_ == -0x80);
  cStack_5a = -(uStack_40._6_1_ == -0x80);
  bStack_59 = -(uStack_40._7_1_ == -0x80);
  auVar3[1] = cStack_67;
  auVar3[0] = local_68;
  auVar3[2] = cStack_66;
  auVar3[3] = cStack_65;
  auVar3[4] = cStack_64;
  auVar3[5] = cStack_63;
  auVar3[6] = cStack_62;
  auVar3[7] = cStack_61;
  auVar3[8] = cStack_60;
  auVar3[9] = cStack_5f;
  auVar3[10] = cStack_5e;
  auVar3[0xb] = cStack_5d;
  auVar3[0xc] = cStack_5c;
  auVar3[0xd] = cStack_5b;
  auVar3[0xe] = cStack_5a;
  auVar3[0xf] = bStack_59;
  local_48 = lVar1;
  uStack_40 = lVar2;
  local_28 = local_38;
  uStack_20 = uStack_30;
  NonIterableBitMask<unsigned_short,_16,_0>::NonIterableBitMask
            ((NonIterableBitMask<unsigned_short,_16,_0> *)((long)&this_local + 6),
             (ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_59 >> 7) << 0xf);
  return (NonIterableBitMask<unsigned_short,_16,_0>)this_local._6_2_;
}

Assistant:

NonIterableBitMask<uint16_t, kWidth> MaskEmpty() const {
#ifdef ABSL_INTERNAL_HAVE_SSSE3
    // This only works because ctrl_t::kEmpty is -128.
    return NonIterableBitMask<uint16_t, kWidth>(
        static_cast<uint16_t>(_mm_movemask_epi8(_mm_sign_epi8(ctrl, ctrl))));
#else
    auto match = _mm_set1_epi8(static_cast<char>(ctrl_t::kEmpty));
    return NonIterableBitMask<uint16_t, kWidth>(
        static_cast<uint16_t>(_mm_movemask_epi8(_mm_cmpeq_epi8(match, ctrl))));
#endif
  }